

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O0

int integerlength(uint n)

{
  undefined4 local_14;
  undefined4 local_10;
  int cnt;
  uint n_local;
  
  cnt = n;
  if (2 < n) {
    local_14 = 1;
    local_10 = n;
    do {
      local_14 = local_14 + 1;
      local_10 = local_10 >> 1;
      cnt = local_14;
    } while (local_10 != 1);
  }
  return cnt;
}

Assistant:

int integerlength(unsigned int n) {
  int cnt;
  if (n <= 2)
    return (n);
  else {
    cnt = 1;
    do {
      cnt++;
      n = (n >> 1);
    } while (n != 1);
    return (cnt);
  }
}